

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall jsonnet::internal::LiteralNumber::~LiteralNumber(LiteralNumber *this)

{
  (this->super_AST)._vptr_AST = (_func_int **)&PTR__LiteralNumber_0028a020;
  std::__cxx11::string::~string((string *)&this->originalString);
  AST::~AST(&this->super_AST);
  return;
}

Assistant:

LiteralNumber(const LocationRange &lr, const Fodder &open_fodder, const std::string &str)
        : AST(lr, AST_LITERAL_NUMBER, open_fodder),
          value(strtod(str.c_str(), nullptr)),
          originalString(str)
    {
    }